

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

bool __thiscall
branch_and_reduce_algorithm::unconfinedReduction_a(branch_and_reduce_algorithm *this)

{
  int *piVar1;
  pointer pvVar2;
  int *piVar3;
  pointer piVar4;
  pointer piVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  void *pvVar7;
  FILE *__stream;
  int iVar8;
  uint uVar9;
  int *piVar10;
  pointer piVar11;
  long lVar12;
  pointer *ppiVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  iterator iVar22;
  vector<int,std::allocator<int>> *pvVar23;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var24;
  ulong uVar25;
  int iVar26;
  pointer piVar27;
  bool bVar28;
  bool bVar29;
  int z;
  vector<int,_std::allocator<int>_> extends;
  vector<int,_std::allocator<int>_> copyOfqs;
  int local_dc;
  long local_d8;
  int local_cc;
  string local_c8;
  pointer local_a8;
  pointer local_a0;
  uint local_94;
  int local_90;
  undefined4 uStack_8c;
  long local_80;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_78;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_70;
  long local_68;
  pointer local_60;
  pointer local_58;
  vector<int,std::allocator<int>> *local_50;
  pointer *local_48;
  vector<int,std::allocator<int>> *local_40;
  pointer *local_38;
  
  uVar9 = this->rn;
  uVar19 = uVar9;
  if (0 < this->n) {
    local_38 = &(this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_40 = (vector<int,std::allocator<int>> *)&this->b_vtcs;
    local_48 = &(this->unconf_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_50 = (vector<int,std::allocator<int>> *)&this->unconf_vtcs;
    local_70 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->packing;
    local_78 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->packingCandidates;
    lVar12 = 0;
    local_94 = uVar9;
    do {
      piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_d8 = lVar12;
      if (piVar11[lVar12] < 0) {
        iVar15 = (this->used).uid;
        iVar26 = iVar15 + 1;
        (this->used).uid = iVar26;
        piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (iVar15 < -1) {
          lVar17 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar27;
          if (lVar17 != 0) {
            uVar21 = 0;
            do {
              piVar27[uVar21] = 0;
              uVar21 = uVar21 + 1;
            } while ((uVar21 & 0xffffffff) < (ulong)(lVar17 >> 2));
          }
          (this->used).uid = 1;
          iVar26 = 1;
        }
        piVar27[lVar12] = iVar26;
        pvVar2 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_68 = lVar12 * 3;
        piVar10 = pvVar2[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar3 = *(pointer *)
                  ((long)&pvVar2[lVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (piVar10 == piVar3) {
          uVar21 = 0;
        }
        else {
          piVar4 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar5 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar21 = 0;
          do {
            iVar26 = *piVar10;
            if (piVar11[iVar26] < 0) {
              piVar27[iVar26] = (this->used).uid;
              iVar15 = (int)uVar21;
              uVar21 = (ulong)(iVar15 + 1);
              piVar4[iVar15] = iVar26;
              piVar5[iVar26] = 1;
            }
            piVar10 = piVar10 + 1;
          } while (piVar10 != piVar3);
        }
        iVar26 = 1;
        do {
          local_c8._M_dataplus._M_p = (pointer)0x0;
          local_c8._M_string_length = 0;
          local_c8.field_2._M_allocated_capacity = 0;
          if (0 < (int)uVar21) {
            bVar28 = true;
            uVar25 = 0;
LAB_0010fc4c:
            iVar15 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar25];
            if ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar15] != 1) goto LAB_0010fcfe;
            local_cc = -1;
            pvVar2 = (this->adj).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar10 = pvVar2[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar3 = *(pointer *)
                      ((long)&pvVar2[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            if (piVar10 != piVar3) {
              iVar15 = -1;
              do {
                iVar18 = *piVar10;
                iVar16 = local_cc;
                if ((((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar18] < 0) &&
                    ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar18] != (this->used).uid)) &&
                   (bVar29 = -1 < iVar15, iVar15 = iVar18, iVar16 = iVar18, bVar29))
                goto LAB_0010fcfe;
                local_cc = iVar16;
                piVar10 = piVar10 + 1;
              } while (piVar10 != piVar3);
              if (iVar15 != -1) {
                if (-1 < iVar15) {
                  if (local_c8._M_string_length == local_c8.field_2._M_allocated_capacity) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_c8,
                               (iterator)local_c8._M_string_length,&local_cc);
                  }
                  else {
                    *(int *)local_c8._M_string_length = iVar15;
                    local_c8._M_string_length = local_c8._M_string_length + 4;
                  }
                }
                goto LAB_0010fcfe;
              }
            }
            if (2 < REDUCTION) {
              _Var6._M_current =
                   (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *_Var6._M_current = 1;
              piVar10 = *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data + local_68 * 8);
              piVar3 = *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data + local_68 * 8 + 8);
              if (piVar10 == piVar3) {
                lVar12 = 1;
              }
              else {
                piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar15 = 1;
                do {
                  if (piVar11[*piVar10] < 0) {
                    lVar12 = (long)iVar15;
                    iVar15 = iVar15 + 1;
                    _Var6._M_current[lVar12] = *piVar10;
                  }
                  piVar10 = piVar10 + 1;
                } while (piVar10 != piVar3);
                lVar12 = (long)iVar15;
              }
              std::vector<int,std::allocator<int>>::
              vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                        ((vector<int,std::allocator<int>> *)&local_90,_Var6,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                         (_Var6._M_current + lVar12),(allocator_type *)&local_dc);
              std::
              vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
              ::emplace_back<std::vector<int,std::allocator<int>>>
                        (local_70,(vector<int,_std::allocator<int>_> *)&local_90);
              if (USE_DEPENDENCY_CHECKING == true) {
                pvVar2 = (this->packing).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                local_dc = (int)((ulong)((long)pvVar2 -
                                        (long)(this->packing).
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555 + -1;
                piVar11 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (4 < (ulong)((long)pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar11)) {
                  uVar25 = 1;
                  do {
                    pvVar23 = (vector<int,std::allocator<int>> *)
                              ((this->packingMap).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + piVar11[uVar25]);
                    iVar22._M_current = *(int **)(pvVar23 + 8);
                    if (iVar22._M_current == *(int **)(pvVar23 + 0x10)) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                (pvVar23,iVar22,&local_dc);
                      piVar11 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                    }
                    else {
                      *iVar22._M_current = local_dc;
                      *(int **)(pvVar23 + 8) = iVar22._M_current + 1;
                    }
                    uVar25 = uVar25 + 1;
                  } while (uVar25 < (ulong)((long)pvVar2[-1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar11 >> 2));
                }
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_emplace_unique<int&>(local_78,&local_dc);
              }
              pvVar7 = (void *)CONCAT44(uStack_8c,local_90);
              if (pvVar7 != (void *)0x0) {
                operator_delete(pvVar7,local_80 - (long)pvVar7);
              }
            }
            set(this,(int)local_d8,1);
            bVar29 = true;
            goto LAB_0010ffa3;
          }
LAB_0010fd1e:
          lVar12 = (long)(local_c8._M_string_length - (long)local_c8._M_dataplus._M_p) >> 2;
          if (lVar12 == 0) {
            bVar29 = true;
            bVar28 = false;
LAB_0010ffa3:
            if ((int *)local_c8._M_dataplus._M_p != (int *)0x0) goto LAB_0010ffa8;
          }
          else {
            if (lVar12 == 1) {
              local_90 = *(int *)local_c8._M_dataplus._M_p;
              if (BRANCHING == 0x1f) {
                iVar22._M_current =
                     (this->unconf_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                ppiVar13 = local_48;
                pvVar23 = local_50;
                if (iVar22._M_current !=
                    (this->unconf_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
LAB_0010fd6c:
                  *iVar22._M_current = local_90;
                  *ppiVar13 = iVar22._M_current + 1;
                  goto LAB_0010fe18;
                }
              }
              else {
                iVar22._M_current =
                     (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                ppiVar13 = local_38;
                pvVar23 = local_40;
                if (iVar22._M_current !=
                    (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_0010fd6c;
              }
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar23,iVar22,&local_90);
            }
LAB_0010fe18:
            iVar15 = *(int *)local_c8._M_dataplus._M_p;
            piVar11 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar11[iVar15] = (this->used).uid;
            iVar26 = iVar26 + 1;
            pvVar2 = (this->adj).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar10 = pvVar2[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar3 = *(pointer *)
                      ((long)&pvVar2[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            if (piVar10 != piVar3) {
              piVar27 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar4 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar5 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              do {
                iVar15 = *piVar10;
                if (piVar27[iVar15] < 0) {
                  iVar18 = (this->used).uid;
                  iVar16 = piVar11[iVar15];
                  piVar11[iVar15] = iVar18;
                  if (iVar16 == iVar18) {
                    piVar1 = piVar5 + iVar15;
                    *piVar1 = *piVar1 + 1;
                  }
                  else {
                    iVar18 = (int)uVar21;
                    uVar21 = (ulong)(iVar18 + 1);
                    piVar4[iVar18] = iVar15;
                    piVar5[iVar15] = 1;
                  }
                }
                piVar10 = piVar10 + 1;
              } while (piVar10 != piVar3);
              bVar28 = false;
              bVar29 = false;
              goto LAB_0010ffa3;
            }
            bVar29 = false;
            bVar28 = false;
LAB_0010ffa8:
            operator_delete(local_c8._M_dataplus._M_p,
                            local_c8.field_2._M_allocated_capacity - (long)local_c8._M_dataplus._M_p
                           );
          }
        } while ((!bVar28) && (!bVar29));
        piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((piVar11[local_d8] < 0) && (1 < iVar26)) {
          iVar15 = (this->used).uid;
          iVar26 = iVar15 + 1;
          (this->used).uid = iVar26;
          if (iVar15 < -1) {
            piVar27 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar12 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar27;
            if (lVar12 != 0) {
              uVar25 = 0;
              do {
                piVar27[uVar25] = 0;
                uVar25 = uVar25 + 1;
              } while ((uVar25 & 0xffffffff) < (ulong)(lVar12 >> 2));
            }
            (this->used).uid = 1;
            iVar26 = 1;
          }
          iVar15 = (int)uVar21;
          if (0 < iVar15) {
            piVar27 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar25 = 0;
            do {
              piVar4[piVar27[uVar25]] = iVar26;
              uVar25 = uVar25 + 1;
            } while (uVar21 != uVar25);
            if (0 < iVar15) {
              pvVar2 = (this->adj).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar27 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              local_a8 = (pointer)(this->level).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
              local_a0 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              uVar25 = 0;
              do {
                piVar27[(long)this->n + (long)(int)uVar25] = -1;
                piVar27[uVar25] = -1;
                iVar26 = *(int *)((long)&(local_a8->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data + uVar25 * 4);
                if (local_a0[iVar26] == 2) {
                  piVar10 = pvVar2[iVar26].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  piVar3 = *(pointer *)
                            ((long)&pvVar2[iVar26].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data + 8);
                  if (piVar10 == piVar3) {
LAB_00110114:
                    iVar18 = -1;
                    iVar26 = -1;
                  }
                  else {
                    iVar26 = -1;
                    iVar18 = -1;
                    do {
                      iVar16 = *piVar10;
                      iVar8 = iVar18;
                      if (((piVar11[iVar16] < 0) &&
                          ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar16] != (this->used).uid)) &&
                         ((iVar8 = iVar16, -1 < iVar18 &&
                          (bVar28 = -1 < iVar26, iVar26 = iVar16, iVar8 = iVar18, bVar28))))
                      goto LAB_00110114;
                      iVar18 = iVar8;
                      piVar10 = piVar10 + 1;
                    } while (piVar10 != piVar3);
                  }
                  iVar16 = iVar26;
                  if (iVar18 < iVar26) {
                    iVar16 = iVar18;
                  }
                  if (iVar26 < iVar18) {
                    iVar26 = iVar18;
                  }
                  piVar27[uVar25] = iVar16;
                  piVar27[(long)this->n + (long)(int)uVar25] = iVar26;
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar21);
              if (0 < iVar15) {
                _Var6._M_current =
                     (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
                local_a0 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                local_58 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                local_60 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                local_a8 = (this->adj).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                uVar20 = 0;
                uVar25 = uVar21;
                _Var24._M_current = _Var6._M_current;
                piVar27 = local_a0;
                do {
                  if ((-1 < _Var6._M_current[uVar20]) &&
                     (-1 < _Var6._M_current[(long)this->n + (long)(int)uVar20])) {
                    iVar15 = local_a0[uVar20];
                    iVar18 = (this->used).uid;
                    iVar26 = iVar18 + 1;
                    (this->used).uid = iVar26;
                    if (iVar18 < -1) {
                      if (local_58 != local_60) {
                        uVar14 = 0;
                        do {
                          local_60[uVar14] = 0;
                          uVar14 = uVar14 + 1;
                        } while ((uVar14 & 0xffffffff) <
                                 (ulong)((long)local_58 - (long)local_60 >> 2));
                      }
                      (this->used).uid = 1;
                      iVar26 = 1;
                    }
                    piVar10 = local_a8[iVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl
                              .super__Vector_impl_data._M_start;
                    piVar3 = *(pointer *)
                              ((long)&local_a8[iVar15].super__Vector_base<int,_std::allocator<int>_>
                                      ._M_impl.super__Vector_impl_data + 8);
                    if (piVar10 != piVar3) {
                      piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      do {
                        if (piVar11[*piVar10] < 0) {
                          piVar4[*piVar10] = iVar26;
                        }
                        piVar10 = piVar10 + 1;
                      } while (piVar10 != piVar3);
                    }
                    if (uVar20 + 1 < uVar21) {
                      uVar14 = 1;
LAB_00110286:
                      if (((_Var6._M_current[uVar20] != _Var24._M_current[uVar14]) ||
                          (_Var6._M_current[(long)(int)uVar20 + (long)this->n] !=
                           _Var24._M_current[(long)this->n + uVar14])) ||
                         ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[piVar27[uVar14]] == iVar26))
                      goto LAB_001102a2;
                      if (2 < REDUCTION) {
                        *_Var6._M_current = 1;
                        piVar10 = *(int **)((long)&(local_a8->
                                                   super__Vector_base<int,_std::allocator<int>_>).
                                                   _M_impl.super__Vector_impl_data + local_68 * 8);
                        piVar3 = *(int **)((long)&(local_a8->
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data + local_68 * 8 + 8
                                          );
                        if (piVar10 == piVar3) {
                          lVar12 = 1;
                        }
                        else {
                          piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start;
                          iVar26 = 1;
                          do {
                            if (piVar11[*piVar10] < 0) {
                              lVar12 = (long)iVar26;
                              iVar26 = iVar26 + 1;
                              _Var6._M_current[lVar12] = *piVar10;
                            }
                            piVar10 = piVar10 + 1;
                          } while (piVar10 != piVar3);
                          lVar12 = (long)iVar26;
                        }
                        std::vector<int,std::allocator<int>>::
                        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                  ((vector<int,std::allocator<int>> *)&local_c8,_Var6,
                                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    )(_Var6._M_current + lVar12),(allocator_type *)&local_90);
                        std::
                        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                        ::emplace_back<std::vector<int,std::allocator<int>>>
                                  (local_70,(vector<int,_std::allocator<int>_> *)&local_c8);
                        if (USE_DEPENDENCY_CHECKING == true) {
                          pvVar2 = (this->packing).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          local_90 = (int)((ulong)((long)pvVar2 -
                                                  (long)(this->packing).
                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                     -0x55555555 + -1;
                          piVar11 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start;
                          if (4 < (ulong)((long)pvVar2[-1].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)piVar11)) {
                            uVar21 = 1;
                            do {
                              pvVar23 = (vector<int,std::allocator<int>> *)
                                        ((this->packingMap).
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + piVar11[uVar21]
                                        );
                              iVar22._M_current = *(int **)(pvVar23 + 8);
                              if (iVar22._M_current == *(int **)(pvVar23 + 0x10)) {
                                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                          (pvVar23,iVar22,&local_90);
                                piVar11 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_start;
                              }
                              else {
                                *iVar22._M_current = local_90;
                                *(int **)(pvVar23 + 8) = iVar22._M_current + 1;
                              }
                              uVar21 = uVar21 + 1;
                            } while (uVar21 < (ulong)((long)pvVar2[-1].
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar11 >> 2));
                          }
                          std::
                          _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                          _M_emplace_unique<int&>(local_78,&local_90);
                        }
                        if ((int *)local_c8._M_dataplus._M_p != (int *)0x0) {
                          operator_delete(local_c8._M_dataplus._M_p,
                                          local_c8.field_2._M_allocated_capacity -
                                          (long)local_c8._M_dataplus._M_p);
                        }
                      }
                      set(this,(int)local_d8,1);
                      break;
                    }
                  }
LAB_001102aa:
                  uVar20 = uVar20 + 1;
                  _Var24._M_current = _Var24._M_current + 1;
                  piVar27 = piVar27 + 1;
                  uVar25 = uVar25 - 1;
                } while (uVar20 != uVar21);
              }
            }
          }
        }
      }
      lVar12 = local_d8 + 1;
    } while (lVar12 < this->n);
    uVar9 = this->rn;
    uVar19 = local_94;
  }
  __stream = _stderr;
  if ((2 < debug) && (uVar19 != uVar9 && this->depth <= this->maxDepth)) {
    debugString_abi_cxx11_(&local_c8,this);
    fprintf(__stream,"%sunconfined: %d -> %d\n",local_c8._M_dataplus._M_p,(ulong)uVar19,
            (ulong)(uint)this->rn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    uVar9 = this->rn;
  }
  return uVar19 != uVar9;
LAB_0010fcfe:
  uVar25 = uVar25 + 1;
  bVar28 = uVar25 < uVar21;
  if (uVar25 == uVar21) goto LAB_0010fd1e;
  goto LAB_0010fc4c;
LAB_001102a2:
  uVar14 = uVar14 + 1;
  if (uVar25 == uVar14) goto LAB_001102aa;
  goto LAB_00110286;
}

Assistant:

bool branch_and_reduce_algorithm::unconfinedReduction_a()
{
    int oldn = rn;
#if 1
    std::vector<int> &NS = level;
    std::vector<int> &deg = iter;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v); // add v to set S
            int p = 1, size = 0;
            for (int u : adj[v]) // add N(v) to set S
                if (x[u] < 0)
                {
                    used.add(u);
                    NS[size++] = u;
                    deg[u] = 1;
                }
            bool ok = false;

            while (!ok) //
            {
                ok = true;
                std::vector<int> extends;

                for (int i = 0; i < size; i++)
                {
                    int const u = NS[i];
                    if (deg[u] != 1)
                    {
                        continue;
                    }
                    int z = -1;
                    for (int const w : adj[u])
                        if (x[w] < 0 && !used.get(w)) // w is in N(u) but not N(S)
                        {
                            if (z >= 0)
                            {
                                z = -2; // |N(u)\N(S)| >= 2
                                break;
                            }
                            z = w;
                        }
                    if (z == -1) // u is child with N(u)\N(S) = 0
                    {
                        if (REDUCTION >= 3)
                        {
                            std::vector<int> &qs = que;
                            int q = 0;
                            qs[q++] = 1;
                            for (int w : adj[v])
                                if (x[w] < 0)
                                    qs[q++] = w;
                            std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                            pushPacking(copyOfqs);
                        }
                        set(v, 1);
                        goto whileloopend;
                    }
                    else if (z >= 0) // u is extending child
                    {
                        extends.push_back(z);
                    }
                }

                if (extends.size() > 0)
                {
                    if (extends.size() == 1)
                    {
                        // unconf_vtcs.push_back(extends[0]);
                        int vtx = extends[0];
                        if (BRANCHING == 31) unconf_vtcs.push_back(vtx);
                        else b_vtcs.push_back(vtx);
                    }
                    int z = extends[0];
                    ok = false;
                    used.add(z);
                    p++;
                    for (int w : adj[z])
                        if (x[w] < 0)
                        {
                            if (used.add(w))
                            {
                                NS[size++] = w;
                                deg[w] = 1;
                            }
                            else
                            {
                                deg[w]++;
                            }
                        }
                }
            }
        whileloopend:
            if (x[v] < 0 && p >= 2)
            {
                used.clear();
                for (int i = 0; i < size; i++)
                    used.add(NS[i]);
                std::vector<int> &vs = que;
                for (int i = 0; i < size; i++)
                {
                    vs[i] = vs[n + i] = -1;
                    int u = NS[i];
                    if (deg[u] != 2)
                        continue;
                    int v1 = -1, v2 = -1;
                    for (int w : adj[u])
                        if (x[w] < 0 && !used.get(w))
                        {
                            if (v1 < 0)
                                v1 = w;
                            else if (v2 < 0)
                                v2 = w;
                            else
                            {
                                v1 = v2 = -1;
                                break;
                            }
                        }
                    if (v1 > v2)
                    {
                        int t = v1;
                        v1 = v2;
                        v2 = t;
                    }
                    vs[i] = v1;
                    vs[n + i] = v2;
                }
                for (int i = 0; i < size; i++)
                    if (vs[i] >= 0 && vs[n + i] >= 0)
                    {
                        int u = NS[i];
                        used.clear();
                        for (int w : adj[u])
                            if (x[w] < 0)
                                used.add(w);
                        for (int j = i + 1; j < size; j++)
                            if (vs[i] == vs[j] && vs[n + i] == vs[n + j] && !used.get(NS[j]))
                            {
                                if (REDUCTION >= 3)
                                {
                                    std::vector<int> &qs = que;
                                    int q = 0;
                                    qs[q++] = 1;
                                    for (int w : adj[v])
                                        if (x[w] < 0)
                                            qs[q++] = w;
                                    std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                                    pushPacking(copyOfqs);
                                }
                                set(v, 1);
                                goto forloopend;
                            }
                    }
            forloopend:;
            }
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sunconfined: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif //0
    return oldn != rn;
}